

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  __off64_t _Var5;
  int *piVar6;
  size_t __n;
  void *pvVar7;
  int local_40;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar4 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar4;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar4;
    offset = offset + __n;
  }
  local_40 = 0;
  pvVar7 = pBuf;
  iVar4 = amt;
  do {
    _Var5 = lseek64(*(int *)&id[3].pMethods,offset,0);
    if (_Var5 < 0) {
      piVar6 = __errno_location();
      *(int *)&id[4].pMethods = *piVar6;
      uVar3 = 0xffffffff;
      goto LAB_0015adcd;
    }
    uVar3 = (*aSyscall[8].pCurrent)((ulong)*(uint *)&id[3].pMethods,pvVar7,(long)iVar4);
    if (iVar4 - uVar3 == 0) goto LAB_0015ada4;
    if ((int)uVar3 < 0) {
      piVar6 = __errno_location();
      bVar2 = true;
      if (*piVar6 != 4) {
        *(int *)&id[4].pMethods = *piVar6;
        local_40 = 0;
        goto LAB_0015ada4;
      }
    }
    else if (uVar3 == 0) {
      bVar2 = false;
    }
    else {
      offset = offset + (ulong)(uVar3 & 0x7fffffff);
      local_40 = local_40 + uVar3;
      pvVar7 = (void *)((long)pvVar7 + (ulong)(uVar3 & 0x7fffffff));
      bVar2 = true;
      iVar4 = iVar4 - uVar3;
    }
  } while (bVar2);
  uVar3 = 0;
LAB_0015ada4:
  uVar3 = uVar3 + local_40;
LAB_0015adcd:
  iVar4 = 0;
  if (amt - uVar3 != 0) {
    if ((int)uVar3 < 0) {
      iVar4 = 0x10a;
    }
    else {
      *(undefined4 *)&id[4].pMethods = 0;
      memset((void *)((long)pBuf + (ulong)uVar3),0,(long)(int)(amt - uVar3));
      iVar4 = 0x20a;
    }
  }
  return iVar4;
}

Assistant:

static int unixRead(
  sqlite3_file *id, 
  void *pBuf, 
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, master-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE 
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transfering
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}